

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_advanced.hpp
# Opt level: O0

void __thiscall
LDPC4QKD::FixedSizeEncoder<unsigned_char,2048ul,4096ul>::
encode<std::array<unsigned_char,4096ul>,std::array<unsigned_char,2048ul>>
          (FixedSizeEncoder<unsigned_char,2048ul,4096ul> *this,array<unsigned_char,_4096UL> *key,
          array<unsigned_char,_2048UL> *syndrome)

{
  size_type sVar1;
  ostream *poVar2;
  out_of_range *this_00;
  string local_1e8 [48];
  stringstream local_1b8 [8];
  stringstream s;
  ostream local_1a8 [376];
  span<unsigned_char,_2048UL> local_30;
  span<const_unsigned_char,_4096UL> local_28;
  array<unsigned_char,_2048UL> *local_20;
  array<unsigned_char,_2048UL> *syndrome_local;
  array<unsigned_char,_4096UL> *key_local;
  FixedSizeEncoder<unsigned_char,_2048UL,_4096UL> *this_local;
  
  local_20 = syndrome;
  syndrome_local = (array<unsigned_char,_2048UL> *)key;
  key_local = (array<unsigned_char,_4096UL> *)this;
  sVar1 = std::array<unsigned_char,_4096UL>::size(key);
  if (sVar1 == 0x1000) {
    sVar1 = std::array<unsigned_char,_2048UL>::size(local_20);
    if (sVar1 == 0x800) {
      std::span<const_unsigned_char,_4096UL>::span<unsigned_char,_4096UL>
                (&local_28,(array<unsigned_char,_4096UL> *)syndrome_local);
      std::span<unsigned_char,_2048UL>::span<unsigned_char,_2048UL>(&local_30,local_20);
      (**(code **)(*(long *)this + 0x28))(this,local_28._M_ptr,local_30._M_ptr);
      return;
    }
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = std::operator<<(local_1a8,"LDPC encoder: incorrect sizes of intput / output arrays\n");
  poVar2 = std::operator<<(poVar2,"RECEIVED: key.size() = ");
  sVar1 = std::array<unsigned_char,_4096UL>::size((array<unsigned_char,_4096UL> *)syndrome_local);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar1);
  poVar2 = std::operator<<(poVar2,". ");
  poVar2 = std::operator<<(poVar2,"syndrome.size() = ");
  sVar1 = std::array<unsigned_char,_2048UL>::size(local_20);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar1);
  poVar2 = std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<(poVar2,"EXPECTED: key.size() = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1000);
  poVar2 = std::operator<<(poVar2,". ");
  poVar2 = std::operator<<(poVar2,"syndrome.size() = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x800);
  std::operator<<(poVar2,".\n");
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::out_of_range::out_of_range(this_00,local_1e8);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void encode(auto const &key, auto &syndrome) const {
            if (key.size() == input_size && syndrome.size() == output_size) {
                encode_span(
                        std::span<bit_type const, input_size>{key},
                        std::span<bit_type, output_size>{syndrome});
            } else {
                std::stringstream s;
                s << "LDPC encoder: incorrect sizes of intput / output arrays\n"
                  << "RECEIVED: key.size() = " << key.size() << ". " << "syndrome.size() = " << syndrome.size() << ".\n"
                  << "EXPECTED: key.size() = " << input_size << ". " << "syndrome.size() = " << output_size << ".\n";
                throw std::out_of_range(s.str());
            }
        }